

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

int luv_spawn(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char **ppcVar5;
  uv_stdio_container_t *puVar6;
  lua_Integer lVar7;
  uv_stream_t *handle;
  uv_process_t *process;
  luv_handle_t *plVar8;
  uv_loop_t *loop;
  uv_stdio_flags uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong n;
  ulong uVar13;
  int iStack_90;
  uv_process_options_t local_80;
  size_t local_40;
  uv_os_fd_t fd;
  
  local_80.stdio = (uv_stdio_container_t *)0x0;
  local_80.uid = 0;
  local_80.gid = 0;
  local_80.cwd = (char *)0x0;
  local_80.flags = 0;
  local_80.stdio_count = 0;
  local_80.args = (char **)0x0;
  local_80.env = (char **)0x0;
  local_80.exit_cb = exit_cb;
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  local_80.flags = 0;
  local_80.file = pcVar3;
  luaL_checktype(L,2,5);
  lua_getfield(L,2,"args");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar4 = lua_rawlen(L,-1);
    uVar13 = sVar4 + 1;
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luv_clean_options(&local_80);
      pcVar3 = "args option must be table";
      iStack_90 = 3;
      goto LAB_00145d04;
    }
    uVar13 = 1;
  }
  ppcVar5 = (char **)malloc(uVar13 * 8 + 8);
  local_80.args = ppcVar5;
  if (ppcVar5 == (char **)0x0) {
    luv_clean_options(&local_80);
    pcVar3 = "Problem allocating args";
LAB_00145df3:
    iVar1 = luaL_error(L,pcVar3);
    return iVar1;
  }
  *ppcVar5 = pcVar3;
  for (n = 1; n < uVar13; n = n + 1) {
    lua_rawgeti(L,-1,n);
    pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
    ppcVar5[n] = pcVar3;
    lua_settop(L,-2);
  }
  ppcVar5[uVar13] = (char *)0x0;
  lua_settop(L,-2);
  lua_getfield(L,2,"stdio");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar4 = lua_rawlen(L,-1);
    local_80.stdio_count = (int)sVar4;
    puVar6 = (uv_stdio_container_t *)malloc(sVar4 << 4);
    local_80.stdio = puVar6;
    if (puVar6 == (uv_stdio_container_t *)0x0) {
      luv_clean_options(&local_80);
      pcVar3 = "Problem allocating stdio";
      goto LAB_00145df3;
    }
    for (lVar10 = 1; lVar10 - sVar4 != 1; lVar10 = lVar10 + 1) {
      lua_rawgeti(L,-1,lVar10);
      iVar1 = lua_type(L,-1);
      if (iVar1 == 3) {
        puVar6->flags = UV_INHERIT_FD;
        lVar7 = lua_tointegerx(L,-1,(int *)0x0);
        (puVar6->data).fd = (int)lVar7;
      }
      else {
        iVar1 = lua_type(L,-1);
        if (iVar1 == 7) {
          handle = luv_check_stream(L,-1);
          iVar1 = uv_fileno((uv_handle_t *)handle,&fd);
          if (((iVar1 == -9) || (uVar9 = UV_INHERIT_STREAM, iVar1 == -0x16)) &&
             (uVar9 = (uint)(lVar10 - 4U < 0xfffffffffffffffe) << 4 |
                      (UV_WRITABLE_PIPE|UV_CREATE_PIPE), lVar10 == 1)) {
            uVar9 = UV_READABLE_PIPE|UV_CREATE_PIPE;
          }
          puVar6->flags = uVar9;
          (puVar6->data).stream = handle;
        }
        else {
          iVar1 = lua_type(L,-1);
          if (iVar1 != 0) {
            luv_clean_options(&local_80);
            pcVar3 = "stdio table entries must be nil, uv_stream_t, or integer";
            goto LAB_00145f76;
          }
          puVar6->flags = UV_IGNORE;
        }
      }
      lua_settop(L,-2);
      puVar6 = puVar6 + 1;
    }
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luv_clean_options(&local_80);
      pcVar3 = "stdio option must be table";
      iStack_90 = 2;
LAB_00145d04:
      iVar1 = luaL_argerror(L,iStack_90,pcVar3);
      return iVar1;
    }
  }
  lua_settop(L,-2);
  lua_getfield(L,2,"env");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    sVar4 = lua_rawlen(L,-1);
    ppcVar5 = (char **)malloc(sVar4 * 8 + 8);
    local_80.env = ppcVar5;
    if (ppcVar5 == (char **)0x0) {
      luv_clean_options(&local_80);
      iVar1 = luaL_error(L,"Problem allocating env");
      return iVar1;
    }
    local_40 = sVar4;
    for (lVar10 = 1; lVar10 - sVar4 != 1; lVar10 = lVar10 + 1) {
      lua_rawgeti(L,-1,lVar10);
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      ppcVar5[lVar10 + -1] = pcVar3;
      lua_settop(L,-2);
    }
    ppcVar5[local_40] = (char *)0x0;
LAB_00145e19:
    uVar12 = 1;
    lua_settop(L,-2);
    lua_getfield(L,2,"cwd");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 4) {
      local_80.cwd = lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options(&local_80);
        pcVar3 = "cwd option must be string";
        goto LAB_00145f76;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"uid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar7 = lua_tointegerx(L,-1,(int *)0x0);
      local_80.uid = (uv_uid_t)lVar7;
      local_80.flags = 1;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options(&local_80);
        pcVar3 = "uid option must be number";
        goto LAB_00145f76;
      }
      uVar12 = 0;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"gid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar7 = lua_tointegerx(L,-1,(int *)0x0);
      local_80.gid = (uv_gid_t)lVar7;
      local_80.flags = uVar12 | 2;
      uVar12 = uVar12 | 2;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options(&local_80);
        pcVar3 = "gid option must be number";
        goto LAB_00145f76;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"verbatim");
    iVar1 = lua_toboolean(L,-1);
    uVar11 = uVar12;
    if (iVar1 != 0) {
      uVar11 = uVar12 | 4;
      local_80.flags = uVar12 | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"detached");
    iVar1 = lua_toboolean(L,-1);
    uVar12 = uVar11;
    if (iVar1 != 0) {
      uVar12 = uVar11 | 8;
      local_80.flags = uVar11 | 8;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"hide");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      local_80.flags = uVar12 | 0x10;
    }
    lua_settop(L,-2);
    process = (uv_process_t *)luv_newuserdata(L,0x88);
    process->type = UV_PROCESS;
    plVar8 = luv_setup_handle(L);
    process->data = plVar8;
    iVar1 = 3;
    iVar2 = lua_type(L,3);
    if (0 < iVar2) {
      luv_check_callback(L,(luv_handle_t *)process->data,1,3);
    }
    loop = luv_loop(L);
    iVar2 = uv_spawn(loop,process,&local_80);
    luv_clean_options(&local_80);
    if (iVar2 < 0) {
      uv_close((uv_handle_t *)process,luv_spawn_close_cb);
      luv_error(L,iVar2);
    }
    else {
      lua_pushinteger(L,(long)process->pid);
      iVar1 = 2;
    }
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) goto LAB_00145e19;
    luv_clean_options(&local_80);
    pcVar3 = "env option must be table";
LAB_00145f76:
    iVar1 = luaL_argerror(L,2,pcVar3);
  }
  return iVar1;
}

Assistant:

static int luv_spawn(lua_State* L) {
  uv_process_t* handle;
  uv_process_options_t options;
  size_t i, len = 0;
  int ret;
  luv_ctx_t* ctx = luv_context(L);

  memset(&options, 0, sizeof(options));
  options.exit_cb = exit_cb;
  options.file = luaL_checkstring(L, 1);
  options.flags = 0;

  // Make sure the 2nd argument is a table
  luaL_checktype(L, 2, LUA_TTABLE);

  // get the args list
  lua_getfield(L, 2, "args");
  // +1 for inserted command at front
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = 1 + lua_rawlen(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 3, "args option must be table");
  }
  else {
    len = 1;
  }
  // +1 for null terminator at end
  options.args = (char**)malloc((len + 1) * sizeof(*options.args));
  if (!options.args) {
    luv_clean_options(&options);
    return luaL_error(L, "Problem allocating args");
  }
  options.args[0] = (char*)options.file;
  for (i = 1; i < len; ++i) {
    lua_rawgeti(L, -1, i);
    options.args[i] = (char*)lua_tostring(L, -1);
    lua_pop(L, 1);
  }
  options.args[len] = NULL;
  lua_pop(L, 1);

  // get the stdio list
  lua_getfield(L, 2, "stdio");
  if (lua_type(L, -1) == LUA_TTABLE) {
    options.stdio_count = len = sparse_rawlen(L, -1);
    options.stdio = (uv_stdio_container_t*)malloc(len * sizeof(*options.stdio));
    if (!options.stdio) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating stdio");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      // integers are assumed to be file descripters
      if (lua_type(L, -1) == LUA_TNUMBER) {
        options.stdio[i].flags = UV_INHERIT_FD;
        options.stdio[i].data.fd = lua_tointeger(L, -1);
      }
      // userdata is assumed to be a uv_stream_t instance
      else if (lua_type(L, -1) == LUA_TUSERDATA) {
        uv_os_fd_t fd;
        uv_stream_t* stream = luv_check_stream(L, -1);
        int err = uv_fileno((uv_handle_t*)stream, &fd);
        if (err == UV_EINVAL || err == UV_EBADF) {
          // stdin (fd 0) is read-only, stdout and stderr (fds 1 & 2) are
          // write-only, and all fds > 2 are read-write
          int flags = UV_CREATE_PIPE;
          if (i == 0 || i > 2)
            flags |= UV_READABLE_PIPE;
          if (i != 0)
            flags |= UV_WRITABLE_PIPE;
          options.stdio[i].flags = (uv_stdio_flags)flags;
        }
        else {
          options.stdio[i].flags = UV_INHERIT_STREAM;
        }
        options.stdio[i].data.stream = stream;
      }
      else if (lua_type(L, -1) == LUA_TNIL) {
        options.stdio[i].flags = UV_IGNORE;
      }
      else {
        luv_clean_options(&options);
        return luaL_argerror(L, 2, "stdio table entries must be nil, uv_stream_t, or integer");
      }
      lua_pop(L, 1);
    }
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "stdio option must be table");
  }
  lua_pop(L, 1);

  // Get the env
  lua_getfield(L, 2, "env");
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = lua_rawlen(L, -1);
    options.env = (char**)malloc((len + 1) * sizeof(*options.env));
    if (!options.env) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating env");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      options.env[i] = (char*)lua_tostring(L, -1);
      lua_pop(L, 1);
    }
    options.env[len] = NULL;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "env option must be table");
  }
  lua_pop(L, 1);

  // Get the cwd
  lua_getfield(L, 2, "cwd");
  if (lua_type(L, -1) == LUA_TSTRING) {
    options.cwd = (char*)lua_tostring(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "cwd option must be string");
  }
  lua_pop(L, 1);

  // Check for uid
  lua_getfield(L, 2, "uid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.uid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETUID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "uid option must be number");
  }
  lua_pop(L, 1);

  // Check for gid
  lua_getfield(L, 2, "gid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.gid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETGID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "gid option must be number");
  }
  lua_pop(L, 1);

  // Check for the boolean flags
  lua_getfield(L, 2, "verbatim");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "detached");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_DETACHED;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE;
  }
  lua_pop(L, 1);
#if LUV_UV_VERSION_GEQ(1, 24, 0)
  lua_getfield(L, 2, "hide_console");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide_gui");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  }
  lua_pop(L, 1);
#endif

  // this will fill the 3rd argument with nil if it doesn't exist so that
  // the uv_process_t userdata doesn't get treated as the 3rd argument
  lua_settop(L, 3);

  handle = (uv_process_t*)luv_newuserdata(L, sizeof(*handle));
  handle->type = UV_PROCESS;
  handle->data = luv_setup_handle(L, ctx);

  if (!lua_isnoneornil(L, 3)) {
    luv_check_callback(L, (luv_handle_t*)handle->data, LUV_EXIT, 3);
  }

  ret = uv_spawn(ctx->loop, handle, &options);

  luv_clean_options(&options);
  if (ret < 0) {
    /* The async callback is required here because luajit GC may reclaim the
     * luv handle before libuv is done closing it down.
     */
    uv_close((uv_handle_t*)handle, luv_spawn_close_cb);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, handle->pid);
  return 2;
}